

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
calculateFibonacci(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int32_t n)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  undefined4 uStack_28;
  int32_t next;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  piVar3 = (pointer)0x0;
  piVar4 = (pointer)0x0;
  _uStack_28 = in_RAX;
  iVar2 = 1;
  iVar1 = 1;
  while (iVar5 = iVar2, (long)piVar4 - (long)piVar3 >> 2 != (long)n) {
    _uStack_28 = CONCAT44(iVar1 + iVar5,uStack_28);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&next);
    piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = next;
    iVar1 = iVar5;
    piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> calculateFibonacci(int32_t n)
{
	std::vector<int32_t> fibonacciSeries;
	int32_t prev = 1;
	int32_t current = 1;
	while (fibonacciSeries.size() != n)
	{
		int32_t next = prev + current;
		fibonacciSeries.push_back(next);
		prev = current;
		current = next;
	}
	return fibonacciSeries;
}